

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::url_seed_alert::url_seed_alert
          (url_seed_alert *this,stack_allocator *alloc,torrent_handle *h,string_view u,error_code *e
          )

{
  error_category *peVar1;
  string_view str;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  string local_78;
  url_seed_alert *local_48;
  char *pcStack_40;
  error_code *local_38;
  error_code *e_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  url_seed_alert *this_local;
  string_view u_local;
  
  u_local.ptr_ = (char *)u.len_;
  this_local = (url_seed_alert *)u.ptr_;
  local_38 = e;
  e_local = (error_code *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__url_seed_alert_00991dc0;
  bVar2 = local_38->failed_;
  uVar3 = *(undefined3 *)&local_38->field_0x5;
  peVar1 = local_38->cat_;
  (this->error).val_ = local_38->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  local_48 = this_local;
  pcStack_40 = u_local.ptr_;
  str.len_ = (size_t)u_local.ptr_;
  str.ptr_ = (char *)this_local;
  aVar4 = libtorrent::aux::stack_allocator::copy_string((stack_allocator *)h_local,str);
  (this->m_url_idx).m_idx = aVar4.m_idx;
  libtorrent::aux::allocation_slot::allocation_slot(&this->m_msg_idx);
  boost::basic_string_view::operator_cast_to_string(&this->url,(basic_string_view *)&this_local);
  boost::system::error_code::message_abi_cxx11_(&local_78,local_38);
  convert_from_native(&this->msg,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

url_seed_alert::url_seed_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, string_view u, error_code const& e)
		: torrent_alert(alloc, h)
		, error(e)
		, m_url_idx(alloc.copy_string(u))
		, m_msg_idx()
#if TORRENT_ABI_VERSION == 1
		, url(u)
		, msg(convert_from_native(e.message()))
#endif
	{}